

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

int __thiscall cmCTestTestHandler::ProcessHandler(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  _Base_ptr *pp_Var10;
  bool collapse;
  uint uVar11;
  pointer pbVar12;
  pointer pcVar13;
  float fVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passed;
  char *local_ac0 [4];
  ulong local_aa0;
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  disabledTests;
  SetOfTests resultsSet;
  ostringstream cmCTestLog_msg;
  pointer local_a30;
  ostringstream cmCTestLog_msg_4;
  ostringstream cmCTestLog_msg_5;
  cmGeneratedFileStream mLogFile;
  
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg,"TestsToRunInformation",(allocator *)&mLogFile);
  pcVar6 = cmCTestGenericHandler::GetOption
                     (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  SetTestsToRunInformation(this,pcVar6);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::string((string *)&cmCTestLog_msg,"UseUnion",(allocator *)&mLogFile);
  pcVar6 = cmCTestGenericHandler::GetOption
                     (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  bVar4 = cmSystemTools::IsOn(pcVar6);
  this->UseUnion = bVar4;
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::string((string *)&cmCTestLog_msg,"ScheduleRandom",(allocator *)&mLogFile);
  pcVar6 = cmCTestGenericHandler::GetOption
                     (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  bVar4 = cmSystemTools::IsOn(pcVar6);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (bVar4) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::string::string((string *)&cmCTestLog_msg,"Random",(allocator *)&mLogFile);
    std::__cxx11::string::_M_assign((string *)&pcVar1->ScheduleType);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  std::__cxx11::string::string((string *)&cmCTestLog_msg,"ParallelLevel",(allocator *)&mLogFile);
  pcVar6 = cmCTestGenericHandler::GetOption
                     (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (pcVar6 != (char *)0x0) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::string::string((string *)&cmCTestLog_msg,"ParallelLevel",(allocator *)&mLogFile);
    pcVar6 = cmCTestGenericHandler::GetOption
                       (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
    iVar5 = atoi(pcVar6);
    cmCTest::SetParallelLevel(pcVar1,iVar5);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg,"LabelRegularExpression",(allocator *)&mLogFile);
  pcVar6 = cmCTestGenericHandler::GetOption
                     (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (pcVar6 != (char *)0x0) {
    this->UseIncludeLabelRegExpFlag = true;
    std::__cxx11::string::assign((char *)&this->IncludeLabelRegExp);
  }
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg,"ExcludeLabelRegularExpression",(allocator *)&mLogFile);
  pcVar6 = cmCTestGenericHandler::GetOption
                     (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (pcVar6 != (char *)0x0) {
    this->UseExcludeLabelRegExpFlag = true;
    std::__cxx11::string::assign((char *)&this->ExcludeLabelRegExp);
  }
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg,"IncludeRegularExpression",(allocator *)&mLogFile);
  pcVar6 = cmCTestGenericHandler::GetOption
                     (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (pcVar6 != (char *)0x0) {
    this->UseIncludeRegExpFlag = true;
    std::__cxx11::string::assign((char *)&this->IncludeRegExp);
  }
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg,"ExcludeRegularExpression",(allocator *)&mLogFile);
  pcVar6 = cmCTestGenericHandler::GetOption
                     (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (pcVar6 != (char *)0x0) {
    this->UseExcludeRegExpFlag = true;
    this->UseExcludeRegExpFirst = (bool)(this->UseIncludeRegExpFlag ^ 1);
    std::__cxx11::string::assign((char *)&this->ExcludeRegExp);
  }
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg,"ExcludeFixtureRegularExpression",(allocator *)&mLogFile);
  pcVar6 = cmCTestGenericHandler::GetOption
                     (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (pcVar6 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->ExcludeFixtureRegExp);
  }
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg,"ExcludeFixtureSetupRegularExpression",(allocator *)&mLogFile
            );
  pcVar6 = cmCTestGenericHandler::GetOption
                     (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (pcVar6 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->ExcludeFixtureSetupRegExp);
  }
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg,"ExcludeFixtureCleanupRegularExpression",
             (allocator *)&mLogFile);
  pcVar6 = cmCTestGenericHandler::GetOption
                     (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (pcVar6 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->ExcludeFixtureCleanupRegExp);
  }
  std::__cxx11::string::string((string *)&cmCTestLog_msg,"RerunFailed",(allocator *)&mLogFile);
  pcVar6 = cmCTestGenericHandler::GetOption
                     (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  bVar4 = cmSystemTools::IsOn(pcVar6);
  this->RerunFailed = bVar4;
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  ::clear(&this->TestResults);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  pcVar6 = "Memory check";
  if (this->MemCheck == false) {
    pcVar6 = "Test";
  }
  poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,pcVar6);
  poVar7 = std::operator<<(poVar7," project ");
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&mLogFile,(SystemTools *)0x1,collapse);
  poVar7 = std::operator<<(poVar7,(string *)&mLogFile);
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::string::~string((string *)&mLogFile);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x1da,(char *)mLogFile.super_ofstream.
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
               ,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&mLogFile);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  iVar5 = (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[6])(this);
  if (iVar5 == 0) {
    return -1;
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&mLogFile,None);
  pcVar6 = "Test";
  if (this->MemCheck != false) {
    pcVar6 = "DynamicAnalysis";
  }
  cmCTestGenericHandler::StartLogFile(&this->super_cmCTestGenericHandler,pcVar6,&mLogFile);
  this->LogFile = (ostream *)&mLogFile;
  passed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  passed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  passed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  failed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  failed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  failed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar2 = cmsys::SystemTools::GetTime();
  ProcessDirectory(this,&passed,&failed);
  dVar3 = cmsys::SystemTools::GetTime();
  uVar11 = (int)((ulong)((long)failed.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)failed.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5) +
           (int)((ulong)((long)passed.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)passed.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  local_aa0 = (ulong)uVar11;
  if (uVar11 == 0) {
    bVar4 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if ((!bVar4) && (((this->super_cmCTestGenericHandler).CTest)->PrintLabels == false)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"No tests were found!!!");
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,500,(char *)_cmCTestLog_msg_4,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
  }
  else {
    if (((passed.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          passed.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) &&
        ((this->super_cmCTestGenericHandler).HandlerVerbose != OUTPUT_NONE)) &&
       ((this->UseIncludeRegExpFlag != false || (this->UseExcludeRegExpFlag == true)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
      poVar7 = std::operator<<(poVar7,"The following tests passed:");
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x1fb,(char *)_cmCTestLog_msg_4,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      for (pbVar12 = passed.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar12 !=
          passed.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"\t");
        poVar7 = std::operator<<(poVar7,(string *)pbVar12);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x1ff,(char *)_cmCTestLog_msg_4,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
    }
    std::
    set<cmCTestTestHandler::cmCTestTestResult,cmCTestTestHandler::cmCTestTestResultLess,std::allocator<cmCTestTestHandler::cmCTestTestResult>>
    ::
    set<__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestResult*,std::vector<cmCTestTestHandler::cmCTestTestResult,std::allocator<cmCTestTestHandler::cmCTestTestResult>>>>
              ((set<cmCTestTestHandler::cmCTestTestResult,cmCTestTestHandler::cmCTestTestResultLess,std::allocator<cmCTestTestHandler::cmCTestTestResult>>
                *)&resultsSet,
               (this->TestResults).
               super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->TestResults).
               super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    disabledTests.
    super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    disabledTests.
    super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    disabledTests.
    super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (p_Var8 = resultsSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &resultsSet._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      bVar4 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &p_Var8[6]._M_right,(char (*) [18])"SKIP_RETURN_CODE=");
      if ((bVar4) ||
         (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&p_Var8[6]._M_right,"Disabled"), bVar4)) {
        std::
        vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
        ::push_back(&disabledTests,(value_type *)(p_Var8 + 1));
      }
    }
    fVar14 = ((float)(ulong)((long)passed.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)passed.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5) * 100.0) /
             (float)(int)local_aa0;
    bVar4 = failed.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            failed.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
    iVar5 = 99;
    if (bVar4 || fVar14 <= 99.0) {
      iVar5 = (int)(fVar14 + 0.5);
    }
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
    poVar7 = std::operator<<(poVar7,"% tests passed, ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," tests failed out of ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)local_aa0);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x219,(char *)_cmCTestLog_msg_4,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmCTest::GetLabelsForSubprojects_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cmCTestLog_msg,(this->super_cmCTestGenericHandler).CTest);
    if (_cmCTestLog_msg == local_a30) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cmCTestLog_msg);
LAB_00321ee0:
      if (((this->super_cmCTestGenericHandler).CTest)->LabelSummary == true) {
        PrintLabelSummary(this);
      }
    }
    else {
      bVar4 = ((this->super_cmCTestGenericHandler).CTest)->SubprojectSummary;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cmCTestLog_msg);
      if (bVar4 != true) goto LAB_00321ee0;
      PrintSubprojectSummary(this);
    }
    sprintf((char *)&cmCTestLog_msg,"%6.2f sec",SUB84(dVar3 - dVar2,0));
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_4);
    poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_4,"\nTotal Test time (real) = ");
    poVar7 = std::operator<<(poVar7,(char *)&cmCTestLog_msg);
    std::operator<<(poVar7,"\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x226,_cmCTestLog_msg_5,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_4);
    if (disabledTests.
        super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        disabledTests.
        super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&cmCTestLog_msg_4,None);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg_5);
      poVar7 = std::operator<<(poVar7,"The following tests did not run:");
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x22b,local_ac0[0],false);
      std::__cxx11::string::~string((string *)local_ac0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
      cmCTestGenericHandler::StartLogFile
                (&this->super_cmCTestGenericHandler,"TestsDisabled",
                 (cmGeneratedFileStream *)&cmCTestLog_msg_4);
      for (pcVar13 = disabledTests.
                     super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pcVar13 !=
          disabledTests.
          super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ._M_impl.super__Vector_impl_data._M_finish; pcVar13 = pcVar13 + 1) {
        poVar7 = (ostream *)std::ostream::operator<<(&cmCTestLog_msg_4,pcVar13->TestCount);
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = std::operator<<(poVar7,(string *)pcVar13);
        std::endl<char,std::char_traits<char>>(poVar7);
        bVar4 = std::operator==(&pcVar13->CompletionStatus,"Disabled");
        pcVar6 = "Skipped";
        if (bVar4) {
          pcVar6 = "Disabled";
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_5,"\t");
        *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 3;
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pcVar13->TestCount);
        poVar7 = std::operator<<(poVar7," - ");
        poVar7 = std::operator<<(poVar7,(string *)pcVar13);
        poVar7 = std::operator<<(poVar7," (");
        poVar7 = std::operator<<(poVar7,pcVar6);
        poVar7 = std::operator<<(poVar7,")");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x23a,local_ac0[0],false);
        std::__cxx11::string::~string((string *)local_ac0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCTestLog_msg_4);
    }
    if (failed.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        failed.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&cmCTestLog_msg_4,None);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg_5);
      poVar7 = std::operator<<(poVar7,"The following tests FAILED:");
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x241,local_ac0[0],false);
      std::__cxx11::string::~string((string *)local_ac0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
      cmCTestGenericHandler::StartLogFile
                (&this->super_cmCTestGenericHandler,"TestsFailed",
                 (cmGeneratedFileStream *)&cmCTestLog_msg_4);
      for (p_Var8 = resultsSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &resultsSet._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        if (*(int *)((long)&p_Var8[5]._M_parent + 4) != 9) {
          bVar4 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &p_Var8[6]._M_right,(char (*) [18])"SKIP_RETURN_CODE=");
          if ((!bVar4) &&
             (bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&p_Var8[6]._M_right,"Disabled"), bVar4)) {
            poVar7 = (ostream *)
                     std::ostream::operator<<(&cmCTestLog_msg_4,*(int *)&p_Var8[9]._M_right);
            poVar7 = std::operator<<(poVar7,":");
            poVar7 = std::operator<<(poVar7,(string *)(p_Var8 + 1));
            std::endl<char,std::char_traits<char>>(poVar7);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
            poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_5,"\t");
            *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 3;
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(int *)&p_Var8[9]._M_right);
            poVar7 = std::operator<<(poVar7," - ");
            poVar7 = std::operator<<(poVar7,(string *)(p_Var8 + 1));
            poVar7 = std::operator<<(poVar7," (");
            uVar9 = (ulong)*(uint *)((long)&p_Var8[5]._M_parent + 4);
            pcVar6 = "No Status";
            if (uVar9 < 10) {
              pp_Var10 = (_Base_ptr *)(GetTestStatus::statuses + uVar9);
              if (uVar9 == 6) {
                pp_Var10 = &p_Var8[5]._M_left;
              }
              pcVar6 = (char *)*pp_Var10;
            }
            poVar7 = std::operator<<(poVar7,pcVar6);
            poVar7 = std::operator<<(poVar7,")");
            std::endl<char,std::char_traits<char>>(poVar7);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                         ,0x24d,local_ac0[0],false);
            std::__cxx11::string::~string((string *)local_ac0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
          }
        }
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCTestLog_msg_4);
    }
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::~vector(&disabledTests);
    std::
    _Rb_tree<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResult,_std::_Identity<cmCTestTestHandler::cmCTestTestResult>,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::~_Rb_tree(&resultsSet._M_t);
  }
  bVar4 = cmCTest::GetProduceXML((this->super_cmCTestGenericHandler).CTest);
  if (bVar4) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&cmCTestLog_msg,None);
    pcVar6 = "Test";
    if (this->MemCheck != false) {
      pcVar6 = "DynamicAnalysis";
    }
    bVar4 = cmCTestGenericHandler::StartResultingXML
                      (&this->super_cmCTestGenericHandler,(uint)this->MemCheck * 2 + PartTest,pcVar6
                       ,(cmGeneratedFileStream *)&cmCTestLog_msg);
    if (bVar4) {
      cmXMLWriter::cmXMLWriter((cmXMLWriter *)&cmCTestLog_msg_4,(ostream *)&cmCTestLog_msg,0);
      (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[9])(this,&cmCTestLog_msg_4);
      cmXMLWriter::~cmXMLWriter((cmXMLWriter *)&cmCTestLog_msg_4);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_4);
      poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_4,"Cannot create ");
      pcVar6 = "testing";
      if (this->MemCheck != false) {
        pcVar6 = "memory check";
      }
      poVar7 = std::operator<<(poVar7,pcVar6);
      poVar7 = std::operator<<(poVar7," XML file");
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x25a,_cmCTestLog_msg_5,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_4);
      this->LogFile = (ostream *)0x0;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCTestLog_msg);
    iVar5 = 1;
    if (!bVar4) goto LAB_003225cc;
  }
  iVar5 = (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[7])(this);
  if (iVar5 == 0) {
    this->LogFile = (ostream *)0x0;
    iVar5 = -1;
  }
  else {
    this->LogFile = (ostream *)0x0;
    iVar5 = -(uint)(failed.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                   failed.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
  }
LAB_003225cc:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&failed);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&passed);
  cmGeneratedFileStream::~cmGeneratedFileStream(&mLogFile);
  return iVar5;
}

Assistant:

int cmCTestTestHandler::ProcessHandler()
{
  // Update internal data structure from generic one
  this->SetTestsToRunInformation(this->GetOption("TestsToRunInformation"));
  this->SetUseUnion(cmSystemTools::IsOn(this->GetOption("UseUnion")));
  if (cmSystemTools::IsOn(this->GetOption("ScheduleRandom"))) {
    this->CTest->SetScheduleType("Random");
  }
  if (this->GetOption("ParallelLevel")) {
    this->CTest->SetParallelLevel(atoi(this->GetOption("ParallelLevel")));
  }

  const char* val;
  val = this->GetOption("LabelRegularExpression");
  if (val) {
    this->UseIncludeLabelRegExpFlag = true;
    this->IncludeLabelRegExp = val;
  }
  val = this->GetOption("ExcludeLabelRegularExpression");
  if (val) {
    this->UseExcludeLabelRegExpFlag = true;
    this->ExcludeLabelRegExp = val;
  }
  val = this->GetOption("IncludeRegularExpression");
  if (val) {
    this->UseIncludeRegExp();
    this->SetIncludeRegExp(val);
  }
  val = this->GetOption("ExcludeRegularExpression");
  if (val) {
    this->UseExcludeRegExp();
    this->SetExcludeRegExp(val);
  }
  val = this->GetOption("ExcludeFixtureRegularExpression");
  if (val) {
    this->ExcludeFixtureRegExp = val;
  }
  val = this->GetOption("ExcludeFixtureSetupRegularExpression");
  if (val) {
    this->ExcludeFixtureSetupRegExp = val;
  }
  val = this->GetOption("ExcludeFixtureCleanupRegularExpression");
  if (val) {
    this->ExcludeFixtureCleanupRegExp = val;
  }
  this->SetRerunFailed(cmSystemTools::IsOn(this->GetOption("RerunFailed")));

  this->TestResults.clear();

  cmCTestOptionalLog(
    this->CTest, HANDLER_OUTPUT, (this->MemCheck ? "Memory check" : "Test")
      << " project " << cmSystemTools::GetCurrentWorkingDirectory()
      << std::endl,
    this->Quiet);
  if (!this->PreProcessHandler()) {
    return -1;
  }

  cmGeneratedFileStream mLogFile;
  this->StartLogFile((this->MemCheck ? "DynamicAnalysis" : "Test"), mLogFile);
  this->LogFile = &mLogFile;

  std::vector<std::string> passed;
  std::vector<std::string> failed;
  int total;

  // start the real time clock
  double clock_start, clock_finish;
  clock_start = cmSystemTools::GetTime();

  this->ProcessDirectory(passed, failed);

  clock_finish = cmSystemTools::GetTime();

  total = int(passed.size()) + int(failed.size());

  if (total == 0) {
    if (!this->CTest->GetShowOnly() && !this->CTest->ShouldPrintLabels()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "No tests were found!!!"
                   << std::endl);
    }
  } else {
    if (this->HandlerVerbose && !passed.empty() &&
        (this->UseIncludeRegExpFlag || this->UseExcludeRegExpFlag)) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl
                           << "The following tests passed:" << std::endl,
                         this->Quiet);
      for (std::vector<std::string>::iterator j = passed.begin();
           j != passed.end(); ++j) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "\t" << *j << std::endl, this->Quiet);
      }
    }

    typedef std::set<cmCTestTestHandler::cmCTestTestResult,
                     cmCTestTestResultLess>
      SetOfTests;
    SetOfTests resultsSet(this->TestResults.begin(), this->TestResults.end());
    std::vector<cmCTestTestHandler::cmCTestTestResult> disabledTests;

    for (SetOfTests::iterator ftit = resultsSet.begin();
         ftit != resultsSet.end(); ++ftit) {
      if (cmHasLiteralPrefix(ftit->CompletionStatus, "SKIP_RETURN_CODE=") ||
          ftit->CompletionStatus == "Disabled") {
        disabledTests.push_back(*ftit);
      }
    }

    float percent = float(passed.size()) * 100.0f / float(total);
    if (!failed.empty() && percent > 99) {
      percent = 99;
    }

    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl
                 << static_cast<int>(percent + .5f) << "% tests passed, "
                 << failed.size() << " tests failed out of " << total
                 << std::endl);

    if (!this->CTest->GetLabelsForSubprojects().empty() &&
        this->CTest->GetSubprojectSummary()) {
      this->PrintSubprojectSummary();
    } else if (this->CTest->GetLabelSummary()) {
      this->PrintLabelSummary();
    }

    char realBuf[1024];
    sprintf(realBuf, "%6.2f sec", (double)(clock_finish - clock_start));
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "\nTotal Test time (real) = " << realBuf << "\n",
                       this->Quiet);

    if (!disabledTests.empty()) {
      cmGeneratedFileStream ofs;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl
                   << "The following tests did not run:" << std::endl);
      this->StartLogFile("TestsDisabled", ofs);

      const char* disabled_reason;
      for (std::vector<cmCTestTestHandler::cmCTestTestResult>::iterator dtit =
             disabledTests.begin();
           dtit != disabledTests.end(); ++dtit) {
        ofs << dtit->TestCount << ":" << dtit->Name << std::endl;
        if (dtit->CompletionStatus == "Disabled") {
          disabled_reason = "Disabled";
        } else {
          disabled_reason = "Skipped";
        }
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "\t"
                     << std::setw(3) << dtit->TestCount << " - " << dtit->Name
                     << " (" << disabled_reason << ")" << std::endl);
      }
    }

    if (!failed.empty()) {
      cmGeneratedFileStream ofs;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl
                   << "The following tests FAILED:" << std::endl);
      this->StartLogFile("TestsFailed", ofs);

      for (SetOfTests::iterator ftit = resultsSet.begin();
           ftit != resultsSet.end(); ++ftit) {
        if (ftit->Status != cmCTestTestHandler::COMPLETED &&
            !cmHasLiteralPrefix(ftit->CompletionStatus, "SKIP_RETURN_CODE=") &&
            ftit->CompletionStatus != "Disabled") {
          ofs << ftit->TestCount << ":" << ftit->Name << std::endl;
          cmCTestLog(this->CTest, HANDLER_OUTPUT, "\t"
                       << std::setw(3) << ftit->TestCount << " - "
                       << ftit->Name << " (" << this->GetTestStatus(&*ftit)
                       << ")" << std::endl);
        }
      }
    }
  }

  if (this->CTest->GetProduceXML()) {
    cmGeneratedFileStream xmlfile;
    if (!this->StartResultingXML(
          (this->MemCheck ? cmCTest::PartMemCheck : cmCTest::PartTest),
          (this->MemCheck ? "DynamicAnalysis" : "Test"), xmlfile)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot create "
                   << (this->MemCheck ? "memory check" : "testing")
                   << " XML file" << std::endl);
      this->LogFile = CM_NULLPTR;
      return 1;
    }
    cmXMLWriter xml(xmlfile);
    this->GenerateDartOutput(xml);
  }

  if (!this->PostProcessHandler()) {
    this->LogFile = CM_NULLPTR;
    return -1;
  }

  if (!failed.empty()) {
    this->LogFile = CM_NULLPTR;
    return -1;
  }
  this->LogFile = CM_NULLPTR;
  return 0;
}